

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

Value * evaluate_call_expression(Scope *scope,CallExpression *call_expression)

{
  FunctionValue *function_value;
  TupleValue *parameter_values;
  Value *pVVar1;
  
  function_value =
       (FunctionValue *)evaluate_expression(scope,call_expression->identifier_expression);
  parameter_values = (TupleValue *)evaluate_expression(scope,call_expression->tuple_expression);
  pVVar1 = new_null_value();
  if ((parameter_values->value).value_type == ValueTypeTupleValue) {
    if ((function_value->value).value_type == ValueTypeFunctionValue) {
      pVVar1 = call_function(scope,function_value,parameter_values);
    }
    if ((function_value->value).value_type == ValueTypeSystemFunctionValue) {
      pVVar1 = (Value *)(*(code *)function_value->arguments)
                                  ((function_value->value).context_value,parameter_values);
    }
  }
  free_value((Value *)function_value);
  free_value((Value *)parameter_values);
  return pVVar1;
}

Assistant:

Value *evaluate_call_expression(Scope *scope, CallExpression *call_expression) {
  Value *identifier_value = evaluate_expression(scope, call_expression->identifier_expression);
  Value *parameter_values = evaluate_expression(scope, call_expression->tuple_expression);

  Value *result_value = new_null_value();

  if (parameter_values->value_type == ValueTypeTupleValue) {
    if (identifier_value->value_type == ValueTypeFunctionValue) {
      result_value = call_function(scope, (FunctionValue *) identifier_value, (TupleValue *) parameter_values);
    }
    if (identifier_value->value_type == ValueTypeSystemFunctionValue) {
      result_value = call_system_function(scope, (SystemFunctionValue *) identifier_value, (TupleValue *) parameter_values);
    }
  }

  free_value(identifier_value);
  free_value(parameter_values);

  return result_value;
}